

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test::
~GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test
          (GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test *this)

{
  GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test *this_local;
  
  ~GeneratedMessageReflection_UnvalidatedStringsAreDowngradedToBytes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, UnvalidatedStringsAreDowngradedToBytes) {
  proto2_unittest::TestChildExtension parsed_msg;
  google::protobuf::TextFormat::ParseFromString(
      R"pb(
        optional_extension <
          [proto2_unittest.repeated_string_extension]: "foo"
        >
      )pb",
      &parsed_msg);
  proto2_unittest::TestChildExtension msg;
  msg.mutable_optional_extension()->AddExtension(
      proto2_unittest::repeated_string_extension, "bar");
  parsed_msg.mutable_optional_extension()->Swap(
      msg.mutable_optional_extension());
}